

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O0

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<11U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,unsigned_long *keys_in,unsigned_long *keys_temp,uint *values_in,uint *values_temp,
          uint32_t size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_R8;
  uint in_R9D;
  uint32_t in_2;
  uint32_t bucket_5;
  uint32_t in_1;
  uint32_t bucket_4;
  uint32_t in;
  uint32_t bucket_3;
  uint32_t out;
  uint *values [2];
  unsigned_long *keys [2];
  uint32_t bucket_2;
  uint32_t i_1;
  uint32_t tsum;
  uint32_t bucket_1;
  uint32_t sum [6];
  uint32_t pos;
  uint32_t shift;
  uint32_t bucket;
  unsigned_long key;
  uint32_t i;
  uint32_t hist [6] [2048];
  PassThrough pass_through;
  PassThrough encode_op;
  PassThrough decode_op;
  uint local_c0bc;
  long local_c0a8 [4];
  uint local_c088;
  uint local_c084;
  int local_c080;
  uint local_c07c;
  int aiStack_c078 [9];
  uint local_c054;
  int local_c050;
  uint local_c04c;
  unsigned_long local_c048;
  uint local_c03c;
  int local_c038 [10240];
  undefined1 auStack_2038 [8203];
  PassThrough local_2d;
  uint local_2c;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_c038,0,0xc000);
  for (local_c03c = 0; local_c03c < local_2c; local_c03c = local_c03c + 1) {
    local_c048 = PassThrough::operator()
                           (&local_2d,*(unsigned_long *)(local_10 + (ulong)local_c03c * 8));
    for (local_c04c = 0; local_c04c < 6; local_c04c = local_c04c + 1) {
      local_c050 = local_c04c * 0xb;
      local_c054 = (uint)(local_c048 >> ((byte)(local_c04c * 0xb) & 0x3f)) & 0x7ff;
      local_c038[(ulong)local_c04c * 0x800 + (ulong)local_c054] =
           local_c038[(ulong)local_c04c * 0x800 + (ulong)local_c054] + 1;
    }
  }
  for (local_c07c = 0; local_c07c < 6; local_c07c = local_c07c + 1) {
    aiStack_c078[local_c07c] = local_c038[(ulong)local_c07c * 0x800];
    local_c038[(ulong)local_c07c * 0x800] = 0;
  }
  for (local_c084 = 1; local_c084 < 0x800; local_c084 = local_c084 + 1) {
    for (local_c088 = 0; local_c088 < 6; local_c088 = local_c088 + 1) {
      iVar1 = local_c038[(ulong)local_c088 * 0x800 + (ulong)local_c084];
      iVar2 = aiStack_c078[local_c088];
      local_c080 = iVar1 + iVar2;
      local_c038[(ulong)local_c088 * 0x800 + (ulong)local_c084] = aiStack_c078[local_c088];
      aiStack_c078[local_c088] = iVar1 + iVar2;
    }
  }
  local_c0a8[2] = local_10;
  local_c0a8[3] = local_18;
  local_c0a8[0] = local_20;
  local_c0a8[1] = local_28;
  RadixSort<11u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (local_10,local_18,local_20,local_28,local_2c,local_c038,0);
  for (local_c0bc = 1; local_c0bc < 5; local_c0bc = local_c0bc + 1) {
    uVar3 = local_c0bc & 1;
    uVar4 = (uint)((uVar3 != 0 ^ 0xffU) & 1);
    RadixSort<11u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
    radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
              (local_c0a8[(ulong)uVar3 + 2],local_c0a8[(ulong)uVar4 + 2],local_c0a8[uVar3],
               local_c0a8[uVar4],local_2c,local_c038 + (ulong)local_c0bc * 0x800,local_c0bc * 0xb);
  }
  RadixSort<11u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (local_c0a8[3],local_c0a8[2],local_c0a8[1],local_c0a8[0],local_2c,auStack_2038,0x37);
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }